

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_CHOICE.c
# Opt level: O1

asn_dec_rval_t
CHOICE_decode_xer(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,void **struct_ptr,
                 char *opt_mname,void *buf_ptr,size_t size)

{
  short *psVar1;
  int *piVar2;
  asn_TYPE_member_s *paVar3;
  asn_TYPE_descriptor_t *paVar4;
  void *pvVar5;
  short sVar6;
  ssize_t sVar7;
  xer_check_tag_e tcv;
  long lVar8;
  asn_dec_rval_t aVar16;
  void **ppvVar9;
  undefined8 ****ppppuVar10;
  undefined8 ****ppppuVar11;
  long extraout_RDX;
  int iVar12;
  uint uVar13;
  ulong unaff_R13;
  ulong uVar14;
  int iVar15;
  size_t num_1;
  pxer_chunk_type_e ch_type;
  void *memb_ptr;
  void **local_a8;
  char *local_88;
  ulong local_80;
  pxer_chunk_type_e local_74;
  int *local_70;
  int *local_68;
  asn_TYPE_descriptor_t *local_60;
  ber_tlv_len_t *local_58;
  void *local_50;
  asn_codec_ctx_t *local_48;
  int *local_40;
  undefined8 ***local_38;
  
  local_88 = opt_mname;
  if (opt_mname == (char *)0x0) {
    local_88 = td->xml_tag;
  }
  piVar2 = (int *)td->specifics;
  local_50 = *struct_ptr;
  local_48 = opt_codec_ctx;
  if (local_50 == (void *)0x0) {
    local_50 = calloc(1,(long)*piVar2);
    *struct_ptr = local_50;
    if (local_50 == (void *)0x0) {
      uVar14 = 2;
      ppvVar9 = (void **)0x0;
      goto LAB_00142b02;
    }
  }
  psVar1 = (short *)((long)local_50 + (long)piVar2[1]);
  if ((*(short *)((long)local_50 + (long)piVar2[1]) == 0) && (*local_88 == '\0')) {
    *psVar1 = 1;
  }
  local_80 = (ulong)(uint)(int)psVar1[1];
  local_40 = (int *)(psVar1 + 2);
  local_58 = (ber_tlv_len_t *)(psVar1 + 8);
  local_70 = &td->elements_count;
  local_a8 = (void **)0x0;
  local_68 = piVar2;
  local_60 = td;
  do {
    pvVar5 = local_50;
    if (4 < *psVar1) goto LAB_00142af2;
    if (*psVar1 == 2) {
      paVar3 = local_60->elements;
      lVar8 = (long)(int)local_80;
      ppppuVar10 = (undefined8 ****)((long)paVar3[lVar8].memb_offset + (long)local_50);
      ppppuVar11 = ppppuVar10;
      if ((paVar3[lVar8].flags & ATF_POINTER) == ATF_NOFLAGS) {
        ppppuVar11 = &local_38;
        local_38 = ppppuVar10;
      }
      aVar16.code = (*(paVar3[lVar8].type)->xer_decoder)
                              (local_48,paVar3[lVar8].type,ppppuVar11,paVar3[lVar8].name,buf_ptr,
                               size);
      local_a8 = (void **)((long)local_a8 + extraout_RDX);
      uVar14 = (ulong)(uint)aVar16.code;
      ppvVar9 = local_a8;
      if (aVar16.code == (asn_dec_rval_t)0x0) {
        lVar8 = (long)local_68[2];
        iVar15 = local_68[3];
        iVar12 = (int)local_80 + 1;
        if (iVar15 == 1) {
          *(char *)((long)pvVar5 + lVar8) = (char)iVar12;
        }
        else if (iVar15 == 2) {
          *(short *)((long)pvVar5 + lVar8) = (short)iVar12;
        }
        else if (iVar15 == 4) {
          *(int *)((long)pvVar5 + lVar8) = iVar12;
        }
        *psVar1 = 3;
        uVar14 = unaff_R13 & 0xffffffff;
        ppvVar9 = struct_ptr;
      }
      uVar13 = (uint)uVar14;
      buf_ptr = (void *)((long)buf_ptr + extraout_RDX);
      size = size - extraout_RDX;
      iVar15 = 1;
      struct_ptr = ppvVar9;
      if (aVar16.code == (asn_dec_rval_t)0x0) goto LAB_001427f4;
      goto LAB_0014289c;
    }
    uVar13 = (uint)unaff_R13;
LAB_001427f4:
    if ((*psVar1 == 3) && (*local_88 == '\0')) {
      *psVar1 = 5;
      uVar14 = 0;
LAB_00142897:
      ppvVar9 = local_a8;
      iVar15 = 1;
      goto LAB_0014289c;
    }
    sVar7 = xer_next_token(local_40,buf_ptr,size,&local_74);
    uVar14 = 2;
    if (sVar7 == -1) {
      ppvVar9 = local_a8;
      iVar15 = 1;
      goto LAB_0014289c;
    }
    ppvVar9 = struct_ptr;
    if (local_74 - PXER_TEXT < 2) {
LAB_0014285d:
      local_a8 = (void **)((long)local_a8 + sVar7);
      size = size - sVar7;
      uVar14 = (ulong)uVar13;
      buf_ptr = (void *)((long)buf_ptr + sVar7);
      iVar15 = 5;
      goto LAB_0014289c;
    }
    iVar15 = 1;
    if (local_74 == PXER_WMORE) {
      uVar14 = 1;
      goto LAB_00142897;
    }
    tcv = xer_check_tag(buf_ptr,(int)sVar7,local_88);
    if (*psVar1 == 4) {
      iVar12 = xer_skip_unknown(tcv,local_58);
      switch(iVar12) {
      case 1:
        *psVar1 = 3;
      case 0:
        goto LAB_0014285d;
      case 2:
        *psVar1 = 3;
        break;
      case -1:
        *psVar1 = 5;
        ppvVar9 = local_a8;
        iVar15 = 1;
        goto LAB_0014289c;
      }
    }
    paVar4 = local_60;
    switch(tcv) {
    case XCT_OPENING:
      if (*psVar1 == 0) {
        *psVar1 = 1;
        goto LAB_0014285d;
      }
    case XCT_UNKNOWN_OP:
    case XCT_UNKNOWN_BO:
      if (*psVar1 == 1) {
        if (0 < local_60->elements_count) {
          lVar8 = 0x38;
          local_80 = 0;
LAB_0014297b:
          tcv = xer_check_tag(buf_ptr,(int)sVar7,*(char **)((long)&paVar4->elements->flags + lVar8))
          ;
          switch(tcv) {
          case XCT_OPENING:
          case XCT_BOTH:
            psVar1[1] = (short)local_80;
            *psVar1 = 2;
            goto LAB_00142a95;
          default:
            local_80 = (ulong)(uint)*local_70;
            goto LAB_00142a95;
          case XCT_UNKNOWN_OP:
          case XCT_UNKNOWN_BO:
            goto switchD_001429af_caseD_5;
          }
        }
        local_80 = 0;
LAB_00142a95:
        iVar15 = 5;
        if ((uint)local_80 == *local_70) {
          if (local_68[10] == -1) goto LAB_00142adb;
          sVar6 = 3;
          if ((tcv & XCT_CLOSING) == XCT_BROKEN) {
            psVar1[8] = 1;
            psVar1[9] = 0;
            psVar1[10] = 0;
            psVar1[0xb] = 0;
            sVar6 = 4;
          }
          *psVar1 = sVar6;
          buf_ptr = (void *)((long)buf_ptr + sVar7);
          size = size - sVar7;
          local_a8 = (void **)((long)local_a8 + sVar7);
        }
      }
      else {
LAB_00142adb:
        iVar15 = 4;
      }
      uVar14 = (ulong)uVar13;
      break;
    case XCT_CLOSING:
      if (*psVar1 == 3) {
        buf_ptr = (void *)((long)buf_ptr + sVar7);
        size = size - sVar7;
        ppvVar9 = (void **)((long)local_a8 + sVar7);
        *psVar1 = 5;
        uVar14 = 0;
        local_a8 = ppvVar9;
      }
      else {
        uVar14 = (ulong)uVar13;
        iVar15 = 4;
      }
      break;
    case XCT_BOTH:
    case XCT__UNK__MASK:
    case XCT_UNKNOWN_CL:
      uVar14 = (ulong)uVar13;
      iVar15 = 4;
      break;
    default:
      uVar14 = (ulong)uVar13;
      iVar15 = 4;
    }
LAB_0014289c:
    unaff_R13 = uVar14;
    struct_ptr = ppvVar9;
  } while (iVar15 == 5);
  if (iVar15 == 4) {
LAB_00142af2:
    *psVar1 = 5;
    uVar14 = 2;
    ppvVar9 = local_a8;
  }
LAB_00142b02:
  aVar16.consumed = (size_t)ppvVar9;
  aVar16._0_8_ = uVar14;
  return aVar16;
switchD_001429af_caseD_5:
  local_80 = local_80 + 1;
  lVar8 = lVar8 + 0x40;
  if ((long)paVar4->elements_count <= (long)local_80) goto LAB_00142a95;
  goto LAB_0014297b;
}

Assistant:

asn_dec_rval_t
CHOICE_decode_xer(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
	void **struct_ptr, const char *opt_mname,
		const void *buf_ptr, size_t size) {
	/*
	 * Bring closer parts of structure description.
	 */
	asn_CHOICE_specifics_t *specs = (asn_CHOICE_specifics_t *)td->specifics;
	const char *xml_tag = opt_mname ? opt_mname : td->xml_tag;

	/*
	 * Parts of the structure being constructed.
	 */
	void *st = *struct_ptr;	/* Target structure. */
	asn_struct_ctx_t *ctx;	/* Decoder context */

	asn_dec_rval_t rval;		/* Return value of a decoder */
	ssize_t consumed_myself = 0;	/* Consumed bytes from ptr */
	int edx;			/* Element index */

	/*
	 * Create the target structure if it is not present already.
	 */
	if(st == 0) {
		st = *struct_ptr = CALLOC(1, specs->struct_size);
		if(st == 0) RETURN(RC_FAIL);
	}

	/*
	 * Restore parsing context.
	 */
	ctx = (asn_struct_ctx_t *)((char *)st + specs->ctx_offset);
	if(ctx->phase == 0 && !*xml_tag)
		ctx->phase = 1;	/* Skip the outer tag checking phase */

	/*
	 * Phases of XER/XML processing:
	 * Phase 0: Check that the opening tag matches our expectations.
	 * Phase 1: Processing body and reacting on closing tag.
	 * Phase 2: Processing inner type.
	 * Phase 3: Only waiting for closing tag.
	 * Phase 4: Skipping unknown extensions.
	 * Phase 5: PHASED OUT
	 */
	for(edx = ctx->step; ctx->phase <= 4;) {
		pxer_chunk_type_e ch_type;	/* XER chunk type */
		ssize_t ch_size;		/* Chunk size */
		xer_check_tag_e tcv;		/* Tag check value */
		asn_TYPE_member_t *elm;

		/*
		 * Go inside the member.
		 */
		if(ctx->phase == 2) {
			asn_dec_rval_t tmprval;
			void *memb_ptr;		/* Pointer to the member */
			void **memb_ptr2;	/* Pointer to that pointer */

			elm = &td->elements[edx];

			if(elm->flags & ATF_POINTER) {
				/* Member is a pointer to another structure */
				memb_ptr2 = (void **)((char *)st
					+ elm->memb_offset);
			} else {
				memb_ptr = (char *)st + elm->memb_offset;
				memb_ptr2 = &memb_ptr;
			}

			/* Start/Continue decoding the inner member */
			tmprval = elm->type->xer_decoder(opt_codec_ctx,
					elm->type, memb_ptr2, elm->name,
					buf_ptr, size);
			XER_ADVANCE(tmprval.consumed);
			ASN_DEBUG("XER/CHOICE: itdf: [%s] code=%d",
				elm->type->name, tmprval.code);
			if(tmprval.code != RC_OK)
				RETURN(tmprval.code);
			assert(_fetch_present_idx(st,
				specs->pres_offset, specs->pres_size) == 0);
			/* Record what we've got */
			_set_present_idx(st,
				specs->pres_offset, specs->pres_size, edx + 1);
			ctx->phase = 3;
			/* Fall through */
		}

		/* No need to wait for closing tag; special mode. */
		if(ctx->phase == 3 && !*xml_tag) {
			ctx->phase = 5;	/* Phase out */
			RETURN(RC_OK);
		}

		/*
		 * Get the next part of the XML stream.
		 */
		ch_size = xer_next_token(&ctx->context, buf_ptr, size, &ch_type);
		if(ch_size == -1) {
            RETURN(RC_FAIL);
        } else {
			switch(ch_type) {
			case PXER_WMORE:
                RETURN(RC_WMORE);
			case PXER_COMMENT:	/* Got XML comment */
			case PXER_TEXT:		/* Ignore free-standing text */
				XER_ADVANCE(ch_size);	/* Skip silently */
				continue;
			case PXER_TAG:
				break;	/* Check the rest down there */
			}
		}

		tcv = xer_check_tag(buf_ptr, ch_size, xml_tag);
		ASN_DEBUG("XER/CHOICE checked [%c%c%c%c] vs [%s], tcv=%d",
			ch_size>0?((const uint8_t *)buf_ptr)[0]:'?',
			ch_size>1?((const uint8_t *)buf_ptr)[1]:'?',
			ch_size>2?((const uint8_t *)buf_ptr)[2]:'?',
			ch_size>3?((const uint8_t *)buf_ptr)[3]:'?',
		xml_tag, tcv);

		/* Skip the extensions section */
		if(ctx->phase == 4) {
			ASN_DEBUG("skip_unknown(%d, %ld)",
				tcv, (long)ctx->left);
			switch(xer_skip_unknown(tcv, &ctx->left)) {
			case -1:
				ctx->phase = 5;
				RETURN(RC_FAIL);
				continue;
			case 1:
				ctx->phase = 3;
				/* Fall through */
			case 0:
				XER_ADVANCE(ch_size);
				continue;
			case 2:
				ctx->phase = 3;
				break;
			}
		}

		switch(tcv) {
		case XCT_BOTH:
			break;	/* No CHOICE? */
		case XCT_CLOSING:
			if(ctx->phase != 3)
				break;
			XER_ADVANCE(ch_size);
			ctx->phase = 5;	/* Phase out */
			RETURN(RC_OK);
		case XCT_OPENING:
			if(ctx->phase == 0) {
				XER_ADVANCE(ch_size);
				ctx->phase = 1;	/* Processing body phase */
				continue;
			}
			/* Fall through */
		case XCT_UNKNOWN_OP:
		case XCT_UNKNOWN_BO:

			if(ctx->phase != 1)
				break;	/* Really unexpected */

			/*
			 * Search which inner member corresponds to this tag.
			 */
			for(edx = 0; edx < td->elements_count; edx++) {
				elm = &td->elements[edx];
				tcv = xer_check_tag(buf_ptr,ch_size,elm->name);
				switch(tcv) {
				case XCT_BOTH:
				case XCT_OPENING:
					/*
					 * Process this member.
					 */
					ctx->step = edx;
					ctx->phase = 2;
					break;
				case XCT_UNKNOWN_OP:
				case XCT_UNKNOWN_BO:
					continue;
				default:
					edx = td->elements_count;
					break;	/* Phase out */
				}
				break;
			}
			if(edx != td->elements_count)
				continue;

			/* It is expected extension */
			if(specs->ext_start != -1) {
				ASN_DEBUG("Got anticipated extension");
				/*
				 * Check for (XCT_BOTH or XCT_UNKNOWN_BO)
				 * By using a mask. Only record a pure
				 * <opening> tags.
				 */
				if(tcv & XCT_CLOSING) {
					/* Found </extension> without body */
					ctx->phase = 3; /* Terminating */
				} else {
					ctx->left = 1;
					ctx->phase = 4; /* Skip ...'s */
				}
				XER_ADVANCE(ch_size);
				continue;
			}

			/* Fall through */
		default:
			break;
		}

		ASN_DEBUG("Unexpected XML tag [%c%c%c%c] in CHOICE [%s]"
			" (ph=%d, tag=%s)",
			ch_size>0?((const uint8_t *)buf_ptr)[0]:'?',
			ch_size>1?((const uint8_t *)buf_ptr)[1]:'?',
			ch_size>2?((const uint8_t *)buf_ptr)[2]:'?',
			ch_size>3?((const uint8_t *)buf_ptr)[3]:'?',
			td->name, ctx->phase, xml_tag);
		break;
	}

	ctx->phase = 5;	/* Phase out, just in case */
	RETURN(RC_FAIL);
}